

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_0::verifySingleColored
               (TestLog *log,ConstPixelBufferAccess *result,Vec4 *refColor)

{
  void **this;
  undefined4 x;
  undefined4 y;
  byte bVar1;
  bool bVar2;
  int width_00;
  int height_00;
  TestLog *pTVar3;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  LogImage local_3d0;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  LogImage local_2f0;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  LogImage local_210;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  LogImageSet local_130;
  deUint32 local_f0;
  undefined1 local_ec [24];
  int px;
  int py;
  PixelBufferAccess local_c0;
  byte local_91;
  undefined1 local_90 [7];
  bool success;
  Surface errorMask;
  undefined1 local_68 [8];
  PixelBufferAccess idealAccess;
  Surface ideal;
  int height;
  int width;
  Vec4 *refColor_local;
  ConstPixelBufferAccess *result_local;
  TestLog *log_local;
  
  width_00 = tcu::ConstPixelBufferAccess::getWidth(result);
  height_00 = tcu::ConstPixelBufferAccess::getWidth(result);
  this = &idealAccess.super_ConstPixelBufferAccess.m_data;
  tcu::Surface::Surface((Surface *)this,width_00,height_00);
  tcu::Surface::getAccess((PixelBufferAccess *)local_68,(Surface *)this);
  tcu::Surface::Surface((Surface *)local_90,width_00,height_00);
  local_91 = 1;
  tcu::Surface::getAccess(&local_c0,(Surface *)local_90);
  px = (int)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&py);
  tcu::clear(&local_c0,(Vec4 *)&py);
  tcu::clear((PixelBufferAccess *)local_68,refColor);
  for (local_ec._20_4_ = 0; (int)local_ec._20_4_ < height_00; local_ec._20_4_ = local_ec._20_4_ + 1)
  {
    for (local_ec._16_4_ = 0; (int)local_ec._16_4_ < width_00; local_ec._16_4_ = local_ec._16_4_ + 1
        ) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_ec,(int)result,local_ec._16_4_,local_ec._20_4_);
      bVar2 = tcu::Vector<float,_4>::operator!=((Vector<float,_4> *)local_ec,refColor);
      y = local_ec._20_4_;
      x = local_ec._16_4_;
      if (bVar2) {
        local_f0 = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel((Surface *)local_90,x,y,(RGBA)local_f0);
        local_91 = 0;
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"VerifyResult",&local_151)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"Verification result",&local_179);
  tcu::LogImageSet::LogImageSet(&local_130,&local_150,&local_178);
  pTVar3 = tcu::TestLog::operator<<(log,&local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"Rendered",&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Rendered image",&local_259);
  tcu::LogImage::LogImage(&local_210,&local_230,&local_258,result,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar3,&local_210);
  tcu::LogImage::~LogImage(&local_210);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  tcu::LogImageSet::~LogImageSet(&local_130);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  if ((local_91 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"Reference",&local_311);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,"Ideal reference image",&local_339);
    tcu::LogImage::LogImage
              (&local_2f0,&local_310,&local_338,
               (Surface *)&idealAccess.super_ConstPixelBufferAccess.m_data,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar3 = tcu::TestLog::operator<<(log,&local_2f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"ErrorMask",&local_3f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"Error mask",&local_419)
    ;
    tcu::LogImage::LogImage
              (&local_3d0,&local_3f0,&local_418,(Surface *)local_90,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar3,&local_3d0);
    tcu::LogImage::~LogImage(&local_3d0);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator(&local_419);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator(&local_3f1);
    tcu::LogImage::~LogImage(&local_2f0);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator(&local_339);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator(&local_311);
  }
  tcu::TestLog::operator<<(log,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  bVar1 = local_91;
  tcu::Surface::~Surface((Surface *)local_90);
  tcu::Surface::~Surface((Surface *)&idealAccess.super_ConstPixelBufferAccess.m_data);
  return (bool)(bVar1 & 1);
}

Assistant:

static bool verifySingleColored (TestLog& log, const ConstPixelBufferAccess& result, const Vec4& refColor)
{
	const int					width			= result.getWidth();
	const int					height			= result.getWidth();
	tcu::Surface				ideal			(width, height);
	const PixelBufferAccess		idealAccess		= ideal.getAccess();
	tcu::Surface				errorMask		(width, height);
	bool						success			= true;

	tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toVec());
	tcu::clear(idealAccess, refColor);

	for (int py = 0; py < height; py++)
	for (int px = 0; px < width; px++)
	{
		if (result.getPixel(px, py) != refColor)
		{
			errorMask.setPixel(px, py, tcu::RGBA::red());
			success = false;
		}
	}

	log << TestLog::ImageSet("VerifyResult", "Verification result")
		<< TestLog::Image("Rendered", "Rendered image", result);

	if (!success)
	{
		log << TestLog::Image("Reference", "Ideal reference image", ideal)
			<< TestLog::Image("ErrorMask", "Error mask", errorMask);
	}

	log << TestLog::EndImageSet;

	return success;
}